

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O0

ON_XMLProperty * __thiscall
ON_XMLNodePropertyIteratorPrivate::GetNextPropertySorted(ON_XMLNodePropertyIteratorPrivate *this)

{
  int iVar1;
  vector<ON_XMLProperty,_std::allocator<ON_XMLProperty>_> *this_00;
  ON_XMLProperty *__x;
  iterator __first;
  iterator __last;
  size_type sVar2;
  ON_XMLProperty *p;
  undefined1 local_30 [8];
  PropertyIterator pi;
  lock_guard<std::recursive_mutex> lg;
  ON_XMLNodePropertyIteratorPrivate *this_local;
  
  if (this->m_iIndex == 0) {
    std::lock_guard<std::recursive_mutex>::lock_guard
              ((lock_guard<std::recursive_mutex> *)&pi._private,&this->m_pNode->_private->m_mutex);
    ON_XMLNode::PropertyIterator::PropertyIterator((PropertyIterator *)local_30,this->m_pNode,false)
    ;
    ON_REMOVE_ASAP_AssertEx
              ((uint)(this->m_paSortedProperties ==
                     (vector<ON_XMLProperty,_std::allocator<ON_XMLProperty>_> *)0x0),
               "/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_xml.cpp"
               ,0xe55,"","m_paSortedProperties == nullptr is false");
    this_00 = (vector<ON_XMLProperty,_std::allocator<ON_XMLProperty>_> *)operator_new(0x18);
    std::vector<ON_XMLProperty,_std::allocator<ON_XMLProperty>_>::vector(this_00);
    this->m_paSortedProperties = this_00;
    while( true ) {
      __x = ON_XMLNode::PropertyIterator::GetNextProperty((PropertyIterator *)local_30);
      if (__x == (ON_XMLProperty *)0x0) break;
      std::vector<ON_XMLProperty,_std::allocator<ON_XMLProperty>_>::push_back
                (this->m_paSortedProperties,__x);
    }
    __first = std::vector<ON_XMLProperty,_std::allocator<ON_XMLProperty>_>::begin
                        (this->m_paSortedProperties);
    __last = std::vector<ON_XMLProperty,_std::allocator<ON_XMLProperty>_>::end
                       (this->m_paSortedProperties);
    std::
    sort<__gnu_cxx::__normal_iterator<ON_XMLProperty*,std::vector<ON_XMLProperty,std::allocator<ON_XMLProperty>>>>
              ((__normal_iterator<ON_XMLProperty_*,_std::vector<ON_XMLProperty,_std::allocator<ON_XMLProperty>_>_>
                )__first._M_current,
               (__normal_iterator<ON_XMLProperty_*,_std::vector<ON_XMLProperty,_std::allocator<ON_XMLProperty>_>_>
                )__last._M_current);
    ON_XMLNode::PropertyIterator::~PropertyIterator((PropertyIterator *)local_30);
    std::lock_guard<std::recursive_mutex>::~lock_guard
              ((lock_guard<std::recursive_mutex> *)&pi._private);
  }
  ON_REMOVE_ASAP_AssertEx
            ((uint)(this->m_paSortedProperties !=
                   (vector<ON_XMLProperty,_std::allocator<ON_XMLProperty>_> *)0x0),
             "/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_xml.cpp"
             ,0xe61,"","m_paSortedProperties != nullptr is false");
  iVar1 = this->m_iIndex;
  sVar2 = std::vector<ON_XMLProperty,_std::allocator<ON_XMLProperty>_>::size
                    (this->m_paSortedProperties);
  if (iVar1 < (int)sVar2) {
    iVar1 = this->m_iIndex;
    this->m_iIndex = iVar1 + 1;
    this_local = (ON_XMLNodePropertyIteratorPrivate *)
                 std::vector<ON_XMLProperty,_std::allocator<ON_XMLProperty>_>::operator[]
                           (this->m_paSortedProperties,(long)iVar1);
  }
  else {
    this_local = (ON_XMLNodePropertyIteratorPrivate *)0x0;
  }
  return (ON_XMLProperty *)this_local;
}

Assistant:

ON_XMLProperty* GetNextPropertySorted(void)
  {
    // First time through, we build the list.
    if (m_iIndex == 0)
    {
      // While sorting properties, don't allow anything else to access the parent node.
      std::lock_guard<std::recursive_mutex> lg(m_pNode->_private->m_mutex);

      ON_XMLNode::PropertyIterator pi(m_pNode, false);

      ON_ASSERT(m_paSortedProperties == nullptr);
      m_paSortedProperties = new std::vector<ON_XMLProperty>;

      ON_XMLProperty* p = nullptr;
      while (nullptr != (p = pi.GetNextProperty()))
      {
        m_paSortedProperties->push_back(*p);
      }

      std::sort(m_paSortedProperties->begin(), m_paSortedProperties->end());
    }

    ON_ASSERT(m_paSortedProperties != nullptr);

    if (m_iIndex >= int(m_paSortedProperties->size()))
      return nullptr;

    return &(*m_paSortedProperties)[m_iIndex++];
  }